

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_urldecode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  undefined8 in_RAX;
  char *zSrc;
  int in_R8D;
  int nLen;
  sxu32 local_14;
  
  local_14 = (sxu32)((ulong)in_RAX >> 0x20);
  if ((0 < nArg) && (zSrc = jx9_value_to_string(*apArg,(int *)&local_14), 0 < (int)local_14)) {
    SyUriDecode(zSrc,local_14,Consumer,pCtx,in_R8D);
    return 0;
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = 0.0;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_urldecode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the input string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Nothing to process, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the URL decoding */
	SyUriDecode(zIn, (sxu32)nLen, Consumer, pCtx, TRUE);
	return JX9_OK;
}